

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx2::SubGridMBIntersectorKPluecker<4,_8,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  undefined4 uVar2;
  BBox1f BVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  Geometry *pGVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  long lVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 (*pauVar36) [16];
  size_t sVar37;
  RayHitK<8> *pRVar38;
  int iVar39;
  uint uVar40;
  AABBNodeMB4D *node1;
  ulong uVar41;
  long lVar42;
  uint uVar43;
  ulong uVar44;
  long lVar45;
  undefined4 uVar46;
  long lVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  undefined1 (*pauVar52) [16];
  ulong uVar53;
  ulong uVar54;
  long lVar55;
  ulong uVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  float fVar70;
  float fVar82;
  float fVar83;
  vint4 ai;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  float fVar84;
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  float fVar85;
  float fVar93;
  float fVar94;
  vint4 ai_4;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  float fVar99;
  vint4 bi;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  vint4 ai_1;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  vint4 bi_1;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [64];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [64];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [64];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  float fVar147;
  float fVar152;
  float fVar153;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar155;
  float fVar156;
  float fVar157;
  undefined1 auVar150 [32];
  float fVar154;
  undefined1 auVar151 [32];
  float fVar160;
  float fVar161;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [64];
  RTCFilterFunctionNArguments args;
  vint4 bi_5;
  vint4 bi_2;
  vbool<8> valid;
  vfloat<4> dist;
  vfloat<4> tNear;
  vint<8> itime;
  vfloat<8> ftime;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_16b1;
  ulong local_16b0;
  uint local_16a8;
  uint local_16a4;
  undefined1 local_16a0 [32];
  ulong local_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  long local_1640;
  long local_1638;
  ulong local_1630;
  ulong local_1628;
  ulong local_1620;
  ulong local_1618;
  size_t local_1610;
  RayHitK<8> *local_1608;
  ulong local_1600;
  undefined1 (*local_15f8) [16];
  long local_15f0;
  long local_15e8;
  long local_15e0;
  Scene *local_15d8;
  ulong local_15d0;
  size_t local_15c8;
  undefined1 local_15c0 [32];
  RTCFilterFunctionNArguments local_1590;
  undefined1 local_1560 [32];
  undefined1 local_1530 [16];
  undefined1 local_1520 [16];
  undefined1 local_1510 [16];
  undefined1 local_1500 [16];
  undefined1 local_14f0 [16];
  float local_14e0;
  float fStack_14dc;
  float fStack_14d8;
  float fStack_14d4;
  float local_14d0;
  float fStack_14cc;
  float fStack_14c8;
  float fStack_14c4;
  float local_14c0;
  float fStack_14bc;
  float fStack_14b8;
  float fStack_14b4;
  float local_14b0;
  float fStack_14ac;
  float fStack_14a8;
  float fStack_14a4;
  float local_14a0;
  float fStack_149c;
  float fStack_1498;
  float fStack_1494;
  float local_1490;
  float fStack_148c;
  float fStack_1488;
  float fStack_1484;
  undefined1 local_1480 [32];
  undefined8 local_1460;
  uint uStack_1458;
  uint uStack_1454;
  uint uStack_1450;
  uint uStack_144c;
  uint uStack_1448;
  uint uStack_1444;
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [16];
  undefined1 local_13f0 [16];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 *local_1380;
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  float local_12e0 [4];
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  undefined4 uStack_12c4;
  float local_12c0 [4];
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  undefined4 uStack_12a4;
  float local_12a0 [4];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  undefined4 uStack_1284;
  undefined1 local_1280 [8];
  float fStack_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  float local_10c0;
  float fStack_10bc;
  float fStack_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float fStack_10a8;
  float fStack_10a4;
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined4 local_1060;
  undefined4 uStack_105c;
  undefined4 uStack_1058;
  undefined4 uStack_1054;
  undefined4 uStack_1050;
  undefined4 uStack_104c;
  undefined4 uStack_1048;
  undefined4 uStack_1044;
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  pauVar52 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar46 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1500._4_4_ = uVar46;
  local_1500._0_4_ = uVar46;
  local_1500._8_4_ = uVar46;
  local_1500._12_4_ = uVar46;
  auVar130 = ZEXT1664(local_1500);
  uVar46 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1510._4_4_ = uVar46;
  local_1510._0_4_ = uVar46;
  local_1510._8_4_ = uVar46;
  local_1510._12_4_ = uVar46;
  auVar137 = ZEXT1664(local_1510);
  uVar46 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_1520._4_4_ = uVar46;
  local_1520._0_4_ = uVar46;
  local_1520._8_4_ = uVar46;
  local_1520._12_4_ = uVar46;
  auVar124 = ZEXT1664(local_1520);
  fStack_14b4 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fStack_14c4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fStack_14d4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fStack_1484 = fStack_14b4 * 0.99999964;
  fStack_1494 = fStack_14c4 * 0.99999964;
  fStack_14a4 = fStack_14d4 * 0.99999964;
  fStack_14b4 = fStack_14b4 * 1.0000004;
  fStack_14c4 = fStack_14c4 * 1.0000004;
  fStack_14d4 = fStack_14d4 * 1.0000004;
  local_15c8 = (size_t)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_1618 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1620 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_1628 = local_15c8 ^ 0x10;
  local_1630 = local_1618 ^ 0x10;
  uVar50 = local_1620 ^ 0x10;
  iVar39 = (tray->tnear).field_0.i[k];
  local_14f0._4_4_ = iVar39;
  local_14f0._0_4_ = iVar39;
  local_14f0._8_4_ = iVar39;
  local_14f0._12_4_ = iVar39;
  auVar191 = ZEXT1664(local_14f0);
  iVar39 = (tray->tfar).field_0.i[k];
  local_1530._4_4_ = iVar39;
  local_1530._0_4_ = iVar39;
  local_1530._8_4_ = iVar39;
  local_1530._12_4_ = iVar39;
  local_1260._16_16_ = mm_lookupmask_ps._240_16_;
  local_1260._0_16_ = mm_lookupmask_ps._0_16_;
  iVar39 = 1 << ((uint)k & 0x1f);
  auVar63._4_4_ = iVar39;
  auVar63._0_4_ = iVar39;
  auVar63._8_4_ = iVar39;
  auVar63._12_4_ = iVar39;
  auVar63._16_4_ = iVar39;
  auVar63._20_4_ = iVar39;
  auVar63._24_4_ = iVar39;
  auVar63._28_4_ = iVar39;
  auVar64 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar63 = vpand_avx2(auVar63,auVar64);
  local_1240 = vpcmpeqd_avx2(auVar63,auVar64);
  auVar74._8_4_ = 0x3f800000;
  auVar74._0_8_ = 0x3f8000003f800000;
  auVar74._12_4_ = 0x3f800000;
  auVar74._16_4_ = 0x3f800000;
  auVar74._20_4_ = 0x3f800000;
  auVar74._24_4_ = 0x3f800000;
  auVar74._28_4_ = 0x3f800000;
  auVar64._8_4_ = 0xbf800000;
  auVar64._0_8_ = 0xbf800000bf800000;
  auVar64._12_4_ = 0xbf800000;
  auVar64._16_4_ = 0xbf800000;
  auVar64._20_4_ = 0xbf800000;
  auVar64._24_4_ = 0xbf800000;
  auVar64._28_4_ = 0xbf800000;
  _local_1280 = vblendvps_avx(auVar74,auVar64,local_1260);
  fStack_1488 = fStack_1484;
  fStack_148c = fStack_1484;
  local_1490 = fStack_1484;
  fStack_1498 = fStack_1494;
  fStack_149c = fStack_1494;
  local_14a0 = fStack_1494;
  fStack_14a8 = fStack_14a4;
  fStack_14ac = fStack_14a4;
  local_14b0 = fStack_14a4;
  fStack_14b8 = fStack_14b4;
  fStack_14bc = fStack_14b4;
  local_14c0 = fStack_14b4;
  fStack_14c8 = fStack_14c4;
  fStack_14cc = fStack_14c4;
  local_14d0 = fStack_14c4;
  fStack_14d8 = fStack_14d4;
  fStack_14dc = fStack_14d4;
  local_14e0 = fStack_14d4;
  local_1608 = ray;
  local_1610 = k;
  local_16b0 = uVar50;
  fVar155 = fStack_14d4;
  fVar154 = fStack_14d4;
  fVar153 = fStack_14d4;
  fVar152 = fStack_14d4;
  fVar147 = fStack_14c4;
  fVar84 = fStack_14c4;
  fVar83 = fStack_14c4;
  fVar184 = fStack_14c4;
  fVar175 = fStack_14b4;
  fVar172 = fStack_14b4;
  fVar169 = fStack_14b4;
  fVar162 = fStack_14b4;
  fVar161 = fStack_14a4;
  fVar160 = fStack_14a4;
  fVar99 = fStack_14a4;
  fVar97 = fStack_14a4;
  fVar96 = fStack_1494;
  fVar95 = fStack_1494;
  fVar94 = fStack_1494;
  fVar93 = fStack_1494;
  fVar85 = fStack_1484;
  fVar82 = fStack_1484;
  fVar70 = fStack_1484;
  fVar98 = fStack_1484;
  uVar56 = local_1628;
  uVar54 = local_1630;
  uVar53 = local_1620;
  uVar49 = local_1618;
LAB_016265c0:
  do {
    do {
      if (pauVar52 == (undefined1 (*) [16])&local_fa0) {
        return;
      }
      pauVar36 = pauVar52 + -1;
      pauVar52 = pauVar52 + -1;
    } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar36 + 8));
    uVar51 = *(ulong *)*pauVar52;
    while ((uVar51 & 8) == 0) {
      uVar41 = uVar51 & 0xfffffffffffffff0;
      uVar46 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar57._4_4_ = uVar46;
      auVar57._0_4_ = uVar46;
      auVar57._8_4_ = uVar46;
      auVar57._12_4_ = uVar46;
      auVar59 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar41 + 0x80 + local_15c8),auVar57,
                                *(undefined1 (*) [16])(uVar41 + 0x20 + local_15c8));
      auVar59 = vsubps_avx(auVar59,auVar130._0_16_);
      auVar58._0_4_ = fVar98 * auVar59._0_4_;
      auVar58._4_4_ = fVar70 * auVar59._4_4_;
      auVar58._8_4_ = fVar82 * auVar59._8_4_;
      auVar58._12_4_ = fVar85 * auVar59._12_4_;
      auVar59 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar41 + 0x80 + uVar49),auVar57,
                                *(undefined1 (*) [16])(uVar41 + 0x20 + uVar49));
      auVar59 = vsubps_avx(auVar59,auVar137._0_16_);
      auVar86._0_4_ = fVar93 * auVar59._0_4_;
      auVar86._4_4_ = fVar94 * auVar59._4_4_;
      auVar86._8_4_ = fVar95 * auVar59._8_4_;
      auVar86._12_4_ = fVar96 * auVar59._12_4_;
      auVar59 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar41 + 0x80 + uVar53),auVar57,
                                *(undefined1 (*) [16])(uVar41 + 0x20 + uVar53));
      auVar61 = auVar124._0_16_;
      auVar59 = vsubps_avx(auVar59,auVar61);
      auVar100._0_4_ = fVar97 * auVar59._0_4_;
      auVar100._4_4_ = fVar99 * auVar59._4_4_;
      auVar100._8_4_ = fVar160 * auVar59._8_4_;
      auVar100._12_4_ = fVar161 * auVar59._12_4_;
      auVar59 = vmaxps_avx(auVar86,auVar100);
      auVar58 = vmaxps_avx(auVar191._0_16_,auVar58);
      auVar59 = vmaxps_avx(auVar58,auVar59);
      auVar58 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar41 + 0x80 + uVar56),auVar57,
                                *(undefined1 (*) [16])(uVar41 + 0x20 + uVar56));
      auVar58 = vsubps_avx(auVar58,auVar130._0_16_);
      auVar87._0_4_ = fVar162 * auVar58._0_4_;
      auVar87._4_4_ = fVar169 * auVar58._4_4_;
      auVar87._8_4_ = fVar172 * auVar58._8_4_;
      auVar87._12_4_ = fVar175 * auVar58._12_4_;
      auVar58 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar41 + 0x80 + uVar54),auVar57,
                                *(undefined1 (*) [16])(uVar41 + 0x20 + uVar54));
      auVar58 = vsubps_avx(auVar58,auVar137._0_16_);
      auVar86 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar41 + 0x80 + uVar50),auVar57,
                                *(undefined1 (*) [16])(uVar41 + 0x20 + uVar50));
      auVar101._0_4_ = fVar184 * auVar58._0_4_;
      auVar101._4_4_ = fVar83 * auVar58._4_4_;
      auVar101._8_4_ = fVar84 * auVar58._8_4_;
      auVar101._12_4_ = fVar147 * auVar58._12_4_;
      auVar58 = vsubps_avx(auVar86,auVar61);
      auVar106._0_4_ = fVar152 * auVar58._0_4_;
      auVar106._4_4_ = fVar153 * auVar58._4_4_;
      auVar106._8_4_ = fVar154 * auVar58._8_4_;
      auVar106._12_4_ = fVar155 * auVar58._12_4_;
      auVar58 = vminps_avx(auVar101,auVar106);
      auVar86 = vminps_avx(local_1530,auVar87);
      auVar58 = vminps_avx(auVar86,auVar58);
      if (((uint)uVar51 & 7) == 6) {
        auVar86 = vcmpps_avx(auVar59,auVar58,2);
        auVar58 = vcmpps_avx(*(undefined1 (*) [16])(uVar41 + 0xe0),auVar57,2);
        auVar57 = vcmpps_avx(auVar57,*(undefined1 (*) [16])(uVar41 + 0xf0),1);
        auVar58 = vandps_avx(auVar58,auVar57);
        auVar58 = vandps_avx(auVar58,auVar86);
      }
      else {
        auVar58 = vcmpps_avx(auVar59,auVar58,2);
      }
      auVar58 = vpslld_avx(auVar58,0x1f);
      uVar43 = vmovmskps_avx(auVar58);
      local_13e0._0_16_ = auVar59;
      root.ptr = local_15c8;
      if (uVar43 == 0) goto LAB_016265c0;
      uVar43 = uVar43 & 0xff;
      root.ptr = 0;
      for (uVar51 = (ulong)uVar43; (uVar51 & 1) == 0; uVar51 = uVar51 >> 1 | 0x8000000000000000) {
        root.ptr = root.ptr + 1;
      }
      uVar51 = *(ulong *)(uVar41 + root.ptr * 8);
      uVar43 = uVar43 - 1 & uVar43;
      uVar44 = (ulong)uVar43;
      if (uVar43 != 0) {
        uVar40 = *(uint *)(local_13e0 + root.ptr * 4);
        root.ptr = 0;
        lVar16 = 0;
        for (; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000) {
          lVar16 = lVar16 + 1;
        }
        uVar43 = uVar43 - 1 & uVar43;
        uVar48 = (ulong)uVar43;
        uVar44 = *(ulong *)(uVar41 + lVar16 * 8);
        uVar6 = *(uint *)(local_13e0 + lVar16 * 4);
        uVar50 = local_16b0;
        if (uVar43 == 0) {
          if (uVar40 < uVar6) {
            *(ulong *)*pauVar52 = uVar44;
            *(uint *)(*pauVar52 + 8) = uVar6;
            pauVar52 = pauVar52 + 1;
          }
          else {
            *(ulong *)*pauVar52 = uVar51;
            *(uint *)(*pauVar52 + 8) = uVar40;
            uVar51 = uVar44;
            pauVar52 = pauVar52 + 1;
          }
        }
        else {
          auVar59._8_8_ = 0;
          auVar59._0_8_ = uVar51;
          auVar59 = vpunpcklqdq_avx(auVar59,ZEXT416(uVar40));
          auVar71._8_8_ = 0;
          auVar71._0_8_ = uVar44;
          auVar58 = vpunpcklqdq_avx(auVar71,ZEXT416(uVar6));
          root.ptr = 0;
          for (; (uVar48 & 1) == 0; uVar48 = uVar48 >> 1 | 0x8000000000000000) {
            root.ptr = root.ptr + 1;
          }
          uVar43 = uVar43 - 1 & uVar43;
          uVar51 = (ulong)uVar43;
          auVar88._8_8_ = 0;
          auVar88._0_8_ = *(ulong *)(uVar41 + root.ptr * 8);
          auVar57 = vpunpcklqdq_avx(auVar88,ZEXT416(*(uint *)(local_13e0 + root.ptr * 4)));
          auVar86 = vpcmpgtd_avx(auVar58,auVar59);
          if (uVar43 == 0) {
            auVar87 = vpshufd_avx(auVar86,0xaa);
            auVar86 = vblendvps_avx(auVar58,auVar59,auVar87);
            auVar59 = vblendvps_avx(auVar59,auVar58,auVar87);
            auVar58 = vpcmpgtd_avx(auVar57,auVar86);
            auVar87 = vpshufd_avx(auVar58,0xaa);
            auVar58 = vblendvps_avx(auVar57,auVar86,auVar87);
            auVar86 = vblendvps_avx(auVar86,auVar57,auVar87);
            auVar57 = vpcmpgtd_avx(auVar86,auVar59);
            auVar87 = vpshufd_avx(auVar57,0xaa);
            auVar57 = vblendvps_avx(auVar86,auVar59,auVar87);
            auVar59 = vblendvps_avx(auVar59,auVar86,auVar87);
            *pauVar52 = auVar59;
            pauVar52[1] = auVar57;
            uVar51 = auVar58._0_8_;
            pauVar52 = pauVar52 + 2;
          }
          else {
            lVar16 = 0;
            for (; (uVar51 & 1) == 0; uVar51 = uVar51 >> 1 | 0x8000000000000000) {
              lVar16 = lVar16 + 1;
            }
            auVar107._8_8_ = 0;
            auVar107._0_8_ = *(ulong *)(uVar41 + lVar16 * 8);
            auVar100 = vpunpcklqdq_avx(auVar107,ZEXT416(*(uint *)(local_13e0 + lVar16 * 4)));
            auVar87 = vpshufd_avx(auVar86,0xaa);
            auVar86 = vblendvps_avx(auVar58,auVar59,auVar87);
            auVar59 = vblendvps_avx(auVar59,auVar58,auVar87);
            auVar58 = vpcmpgtd_avx(auVar100,auVar57);
            auVar87 = vpshufd_avx(auVar58,0xaa);
            auVar58 = vblendvps_avx(auVar100,auVar57,auVar87);
            auVar57 = vblendvps_avx(auVar57,auVar100,auVar87);
            auVar87 = vpcmpgtd_avx(auVar57,auVar59);
            auVar100 = vpshufd_avx(auVar87,0xaa);
            auVar87 = vblendvps_avx(auVar57,auVar59,auVar100);
            auVar59 = vblendvps_avx(auVar59,auVar57,auVar100);
            auVar57 = vpcmpgtd_avx(auVar58,auVar86);
            auVar100 = vpshufd_avx(auVar57,0xaa);
            auVar57 = vblendvps_avx(auVar58,auVar86,auVar100);
            auVar58 = vblendvps_avx(auVar86,auVar58,auVar100);
            auVar86 = vpcmpgtd_avx(auVar87,auVar58);
            auVar100 = vpshufd_avx(auVar86,0xaa);
            auVar86 = vblendvps_avx(auVar87,auVar58,auVar100);
            auVar58 = vblendvps_avx(auVar58,auVar87,auVar100);
            *pauVar52 = auVar59;
            pauVar52[1] = auVar58;
            pauVar52[2] = auVar86;
            auVar124 = ZEXT1664(auVar61);
            uVar51 = auVar57._0_8_;
            pauVar52 = pauVar52 + 3;
          }
        }
      }
    }
    local_1640 = (ulong)((uint)uVar51 & 0xf) - 8;
    uVar51 = uVar51 & 0xfffffffffffffff0;
    local_1600 = uVar51;
    local_15f8 = pauVar52;
    for (local_1638 = 0; local_1638 != local_1640; local_1638 = local_1638 + 1) {
      local_15f0 = local_1638 * 0x90;
      uVar41 = *(ulong *)(uVar51 + 0x20 + local_15f0);
      auVar60._8_8_ = 0;
      auVar60._0_8_ = uVar41;
      auVar59 = vpmovzxbd_avx(auVar60);
      auVar59 = vcvtdq2ps_avx(auVar59);
      uVar46 = *(undefined4 *)(uVar51 + 0x44 + local_15f0);
      auVar125._4_4_ = uVar46;
      auVar125._0_4_ = uVar46;
      auVar125._8_4_ = uVar46;
      auVar125._12_4_ = uVar46;
      uVar46 = *(undefined4 *)(uVar51 + 0x38 + local_15f0);
      auVar131._4_4_ = uVar46;
      auVar131._0_4_ = uVar46;
      auVar131._8_4_ = uVar46;
      auVar131._12_4_ = uVar46;
      auVar86 = vfmadd213ps_fma(auVar59,auVar125,auVar131);
      auVar108._8_8_ = 0;
      auVar108._0_8_ = *(ulong *)(uVar51 + 0x50 + local_15f0);
      auVar59 = vpmovzxbd_avx(auVar108);
      auVar59 = vcvtdq2ps_avx(auVar59);
      uVar46 = *(undefined4 *)(uVar51 + 0x74 + local_15f0);
      auVar138._4_4_ = uVar46;
      auVar138._0_4_ = uVar46;
      auVar138._8_4_ = uVar46;
      auVar138._12_4_ = uVar46;
      uVar46 = *(undefined4 *)(uVar51 + 0x68 + local_15f0);
      auVar142._4_4_ = uVar46;
      auVar142._0_4_ = uVar46;
      auVar142._8_4_ = uVar46;
      auVar142._12_4_ = uVar46;
      auVar57 = vfmadd213ps_fma(auVar59,auVar138,auVar142);
      auVar72._8_8_ = 0;
      auVar72._0_8_ = *(ulong *)(uVar51 + 0x24 + local_15f0);
      auVar59 = vpmovzxbd_avx(auVar72);
      auVar59 = vcvtdq2ps_avx(auVar59);
      auVar87 = vfmadd213ps_fma(auVar59,auVar125,auVar131);
      auVar126._8_8_ = 0;
      auVar126._0_8_ = *(ulong *)(uVar51 + 0x54 + local_15f0);
      auVar59 = vpmovzxbd_avx(auVar126);
      auVar59 = vcvtdq2ps_avx(auVar59);
      auVar100 = vfmadd213ps_fma(auVar59,auVar138,auVar142);
      auVar132._8_8_ = 0;
      auVar132._0_8_ = *(ulong *)(uVar51 + 0x28 + local_15f0);
      auVar59 = vpmovzxbd_avx(auVar132);
      auVar59 = vcvtdq2ps_avx(auVar59);
      uVar46 = *(undefined4 *)(uVar51 + 0x48 + local_15f0);
      auVar148._4_4_ = uVar46;
      auVar148._0_4_ = uVar46;
      auVar148._8_4_ = uVar46;
      auVar148._12_4_ = uVar46;
      uVar46 = *(undefined4 *)(uVar51 + 0x3c + local_15f0);
      auVar158._4_4_ = uVar46;
      auVar158._0_4_ = uVar46;
      auVar158._8_4_ = uVar46;
      auVar158._12_4_ = uVar46;
      auVar101 = vfmadd213ps_fma(auVar59,auVar148,auVar158);
      auVar139._8_8_ = 0;
      auVar139._0_8_ = *(ulong *)(uVar51 + 0x58 + local_15f0);
      auVar59 = vpmovzxbd_avx(auVar139);
      auVar59 = vcvtdq2ps_avx(auVar59);
      uVar46 = *(undefined4 *)(uVar51 + 0x78 + local_15f0);
      auVar165._4_4_ = uVar46;
      auVar165._0_4_ = uVar46;
      auVar165._8_4_ = uVar46;
      auVar165._12_4_ = uVar46;
      uVar46 = *(undefined4 *)(uVar51 + 0x6c + local_15f0);
      auVar185._4_4_ = uVar46;
      auVar185._0_4_ = uVar46;
      auVar185._8_4_ = uVar46;
      auVar185._12_4_ = uVar46;
      auVar106 = vfmadd213ps_fma(auVar59,auVar165,auVar185);
      auVar143._8_8_ = 0;
      auVar143._0_8_ = *(ulong *)(uVar51 + 0x2c + local_15f0);
      auVar59 = vpmovzxbd_avx(auVar143);
      auVar59 = vcvtdq2ps_avx(auVar59);
      auVar61 = vfmadd213ps_fma(auVar59,auVar148,auVar158);
      auVar149._8_8_ = 0;
      auVar149._0_8_ = *(ulong *)(uVar51 + 0x5c + local_15f0);
      auVar59 = vpmovzxbd_avx(auVar149);
      auVar59 = vcvtdq2ps_avx(auVar59);
      auVar71 = vfmadd213ps_fma(auVar59,auVar165,auVar185);
      auVar159._8_8_ = 0;
      auVar159._0_8_ = *(ulong *)(uVar51 + 0x30 + local_15f0);
      auVar59 = vpmovzxbd_avx(auVar159);
      auVar59 = vcvtdq2ps_avx(auVar59);
      uVar46 = *(undefined4 *)(uVar51 + 0x4c + local_15f0);
      auVar166._4_4_ = uVar46;
      auVar166._0_4_ = uVar46;
      auVar166._8_4_ = uVar46;
      auVar166._12_4_ = uVar46;
      uVar46 = *(undefined4 *)(uVar51 + 0x40 + local_15f0);
      auVar186._4_4_ = uVar46;
      auVar186._0_4_ = uVar46;
      auVar186._8_4_ = uVar46;
      auVar186._12_4_ = uVar46;
      auVar88 = vfmadd213ps_fma(auVar59,auVar166,auVar186);
      auVar188._8_8_ = 0;
      auVar188._0_8_ = *(ulong *)(uVar51 + 0x60 + local_15f0);
      auVar59 = vpmovzxbd_avx(auVar188);
      auVar59 = vcvtdq2ps_avx(auVar59);
      auVar189._8_8_ = 0;
      auVar189._0_8_ = *(ulong *)(uVar51 + 0x34 + local_15f0);
      auVar58 = vpmovzxbd_avx(auVar189);
      auVar58 = vcvtdq2ps_avx(auVar58);
      auVar58 = vfmadd213ps_fma(auVar58,auVar166,auVar186);
      uVar46 = *(undefined4 *)(uVar51 + 0x7c + local_15f0);
      auVar167._4_4_ = uVar46;
      auVar167._0_4_ = uVar46;
      auVar167._8_4_ = uVar46;
      auVar167._12_4_ = uVar46;
      uVar46 = *(undefined4 *)(uVar51 + 0x70 + local_15f0);
      auVar187._4_4_ = uVar46;
      auVar187._0_4_ = uVar46;
      auVar187._8_4_ = uVar46;
      auVar187._12_4_ = uVar46;
      auVar107 = vfmadd213ps_fma(auVar59,auVar167,auVar187);
      auVar89._8_8_ = 0;
      auVar89._0_8_ = *(ulong *)(uVar51 + 100 + local_15f0);
      auVar59 = vpmovzxbd_avx(auVar89);
      auVar59 = vcvtdq2ps_avx(auVar59);
      auVar73 = vfmadd213ps_fma(auVar59,auVar167,auVar187);
      fVar98 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(uVar51 + 0x80 + local_15f0)) *
               *(float *)(uVar51 + 0x84 + local_15f0);
      auVar168._4_4_ = fVar98;
      auVar168._0_4_ = fVar98;
      auVar168._8_4_ = fVar98;
      auVar168._12_4_ = fVar98;
      auVar59 = vsubps_avx(auVar57,auVar86);
      auVar86 = vfmadd213ps_fma(auVar59,auVar168,auVar86);
      auVar59 = vsubps_avx(auVar100,auVar87);
      auVar57 = vfmadd213ps_fma(auVar59,auVar168,auVar87);
      auVar59 = vsubps_avx(auVar106,auVar101);
      auVar87 = vfmadd213ps_fma(auVar59,auVar168,auVar101);
      auVar59 = vsubps_avx(auVar71,auVar61);
      auVar100 = vfmadd213ps_fma(auVar59,auVar168,auVar61);
      auVar59 = vsubps_avx(auVar107,auVar88);
      auVar101 = vfmadd213ps_fma(auVar59,auVar168,auVar88);
      auVar59 = vsubps_avx(auVar73,auVar58);
      auVar106 = vfmadd213ps_fma(auVar59,auVar168,auVar58);
      auVar191 = ZEXT1664(local_14f0);
      auVar59 = vpminub_avx(auVar60,auVar72);
      auVar61._8_8_ = 0;
      auVar61._0_8_ = uVar41;
      auVar59 = vpcmpeqb_avx(auVar61,auVar59);
      auVar58 = vsubps_avx(auVar86,local_1500);
      auVar73._0_4_ = local_1490 * auVar58._0_4_;
      auVar73._4_4_ = fStack_148c * auVar58._4_4_;
      auVar73._8_4_ = fStack_1488 * auVar58._8_4_;
      auVar73._12_4_ = fStack_1484 * auVar58._12_4_;
      auVar58 = vsubps_avx(auVar87,local_1510);
      auVar109._0_4_ = local_14a0 * auVar58._0_4_;
      auVar109._4_4_ = fStack_149c * auVar58._4_4_;
      auVar109._8_4_ = fStack_1498 * auVar58._8_4_;
      auVar109._12_4_ = fStack_1494 * auVar58._12_4_;
      auVar58 = vsubps_avx(auVar57,local_1500);
      auVar102._0_4_ = local_14c0 * auVar58._0_4_;
      auVar102._4_4_ = fStack_14bc * auVar58._4_4_;
      auVar102._8_4_ = fStack_14b8 * auVar58._8_4_;
      auVar102._12_4_ = fStack_14b4 * auVar58._12_4_;
      auVar58 = vsubps_avx(auVar100,local_1510);
      auVar114._0_4_ = local_14d0 * auVar58._0_4_;
      auVar114._4_4_ = fStack_14cc * auVar58._4_4_;
      auVar114._8_4_ = fStack_14c8 * auVar58._8_4_;
      auVar114._12_4_ = fStack_14c4 * auVar58._12_4_;
      auVar86 = vpminsd_avx(auVar73,auVar102);
      auVar58 = vpmaxsd_avx(auVar73,auVar102);
      auVar57 = vpminsd_avx(auVar109,auVar114);
      auVar86 = vpmaxsd_avx(auVar86,auVar57);
      auVar57 = vpmaxsd_avx(auVar109,auVar114);
      auVar87 = vsubps_avx(auVar101,local_1520);
      auVar115._0_4_ = local_14b0 * auVar87._0_4_;
      auVar115._4_4_ = fStack_14ac * auVar87._4_4_;
      auVar115._8_4_ = fStack_14a8 * auVar87._8_4_;
      auVar115._12_4_ = fStack_14a4 * auVar87._12_4_;
      auVar87 = vsubps_avx(auVar106,local_1520);
      auVar90._0_4_ = local_14e0 * auVar87._0_4_;
      auVar90._4_4_ = fStack_14dc * auVar87._4_4_;
      auVar90._8_4_ = fStack_14d8 * auVar87._8_4_;
      auVar90._12_4_ = fStack_14d4 * auVar87._12_4_;
      auVar87 = vpminsd_avx(auVar58,auVar57);
      auVar57 = vpminsd_avx(auVar115,auVar90);
      auVar58 = vpmaxsd_avx(auVar115,auVar90);
      auVar57 = vpmaxsd_avx(auVar57,local_14f0);
      local_13f0 = vpmaxsd_avx(auVar86,auVar57);
      auVar58 = vpminsd_avx(auVar58,local_1530);
      auVar58 = vpminsd_avx(auVar87,auVar58);
      local_16a0._0_4_ = auVar59._0_4_;
      auVar86 = vpmovsxbd_avx(ZEXT416((uint)local_16a0._0_4_));
      auVar59 = vpcmpgtd_avx(local_13f0,auVar58);
      auVar59 = vpandn_avx(auVar59,auVar86);
      uVar46 = vmovmskps_avx(auVar59);
      local_15d0 = CONCAT44((int)(root.ptr >> 0x20),uVar46);
      local_15f0 = local_15f0 + uVar51;
      fVar98 = local_1490;
      fVar70 = fStack_148c;
      fVar82 = fStack_1488;
      fVar85 = fStack_1484;
      fVar93 = local_14a0;
      fVar94 = fStack_149c;
      fVar95 = fStack_1498;
      fVar96 = fStack_1494;
      fVar97 = local_14b0;
      fVar99 = fStack_14ac;
      fVar160 = fStack_14a8;
      fVar161 = fStack_14a4;
      fVar162 = local_14c0;
      fVar169 = fStack_14bc;
      fVar172 = fStack_14b8;
      fVar175 = fStack_14b4;
      fVar184 = local_14d0;
      fVar83 = fStack_14cc;
      fVar84 = fStack_14c8;
      fVar147 = fStack_14c4;
      fVar152 = local_14e0;
      fVar153 = fStack_14dc;
      fVar154 = fStack_14d8;
      fVar155 = fStack_14d4;
      while (pRVar38 = local_1608, sVar37 = local_1610, local_15d0 != 0) {
        lVar16 = 0;
        for (uVar41 = local_15d0; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x8000000000000000) {
          lVar16 = lVar16 + 1;
        }
        local_15d0 = local_15d0 - 1 & local_15d0;
        fVar1 = *(float *)(ray + k * 4 + 0x100);
        if (*(float *)(local_13f0 + lVar16 * 4) <= fVar1) {
          local_1400 = ZEXT416((uint)fVar1);
          uVar4 = *(ushort *)(local_15f0 + lVar16 * 8);
          uVar5 = *(ushort *)(local_15f0 + 2 + lVar16 * 8);
          uStack_1458 = *(uint *)(local_15f0 + 0x88);
          local_1660._4_4_ = *(uint *)(local_15f0 + 4 + lVar16 * 8);
          local_1668 = (ulong)local_1660._4_4_;
          local_15d8 = context->scene;
          pGVar7 = (local_15d8->geometries).items[uStack_1458].ptr;
          local_15e0 = *(long *)&pGVar7->field_0x58;
          BVar3 = pGVar7->time_range;
          auVar62._8_8_ = 0;
          auVar62._0_4_ = BVar3.lower;
          auVar62._4_4_ = BVar3.upper;
          fVar98 = BVar3.lower;
          auVar75._4_4_ = fVar98;
          auVar75._0_4_ = fVar98;
          auVar75._8_4_ = fVar98;
          auVar75._12_4_ = fVar98;
          auVar75._16_4_ = fVar98;
          auVar75._20_4_ = fVar98;
          auVar75._24_4_ = fVar98;
          auVar75._28_4_ = fVar98;
          fVar98 = pGVar7->fnumTimeSegments;
          auVar63 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar75);
          auVar59 = vmovshdup_avx(auVar62);
          auVar59 = vsubps_avx(auVar59,auVar62);
          auVar65._0_4_ = auVar59._0_4_;
          auVar65._4_4_ = auVar65._0_4_;
          auVar65._8_4_ = auVar65._0_4_;
          auVar65._12_4_ = auVar65._0_4_;
          auVar65._16_4_ = auVar65._0_4_;
          auVar65._20_4_ = auVar65._0_4_;
          auVar65._24_4_ = auVar65._0_4_;
          auVar65._28_4_ = auVar65._0_4_;
          auVar63 = vdivps_avx(auVar63,auVar65);
          local_15e8 = pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                       local_1668;
          auVar15._4_4_ = fVar98 * auVar63._4_4_;
          auVar15._0_4_ = fVar98 * auVar63._0_4_;
          auVar15._8_4_ = fVar98 * auVar63._8_4_;
          auVar15._12_4_ = fVar98 * auVar63._12_4_;
          auVar15._16_4_ = fVar98 * auVar63._16_4_;
          auVar15._20_4_ = fVar98 * auVar63._20_4_;
          auVar15._24_4_ = fVar98 * auVar63._24_4_;
          auVar15._28_4_ = auVar63._28_4_;
          auVar63 = vroundps_avx(auVar15,1);
          fVar98 = fVar98 + -1.0;
          auVar91._4_4_ = fVar98;
          auVar91._0_4_ = fVar98;
          auVar91._8_4_ = fVar98;
          auVar91._12_4_ = fVar98;
          auVar91._16_4_ = fVar98;
          auVar91._20_4_ = fVar98;
          auVar91._24_4_ = fVar98;
          auVar91._28_4_ = fVar98;
          auVar63 = vminps_avx(auVar63,auVar91);
          auVar63 = vmaxps_avx(auVar63,_DAT_01f7b000);
          local_10e0 = vsubps_avx(auVar15,auVar63);
          local_1100 = vcvtps2dq_avx(auVar63);
          local_16a4 = uVar4 & 0x7fff;
          local_16a8 = uVar5 & 0x7fff;
          uVar43 = *(uint *)(local_15e0 + 4 + local_15e8);
          uVar53 = (ulong)uVar43;
          uVar49 = (ulong)(uVar43 * local_16a8 + *(int *)(local_15e0 + local_15e8) + local_16a4);
          lVar8 = *(long *)&pGVar7[2].numPrimitives;
          lVar55 = (long)*(int *)(local_1100 + k * 4) * 0x38;
          lVar9 = *(long *)(lVar8 + 0x10 + lVar55);
          lVar10 = *(long *)(lVar8 + lVar55);
          auVar59 = *(undefined1 (*) [16])(lVar10 + lVar9 * uVar49);
          lVar11 = *(long *)(lVar8 + 0x48 + lVar55);
          auVar58 = *(undefined1 (*) [16])(lVar10 + (uVar49 + 1) * lVar9);
          lVar16 = uVar49 + uVar53;
          auVar86 = *(undefined1 (*) [16])(lVar10 + lVar16 * lVar9);
          lVar47 = uVar49 + uVar53 + 1;
          auVar87 = *(undefined1 (*) [16])(lVar10 + lVar47 * lVar9);
          lVar42 = uVar49 + (-1 < (short)uVar4) + 1;
          auVar57 = *(undefined1 (*) [16])(lVar10 + lVar42 * lVar9);
          lVar45 = (ulong)(-1 < (short)uVar4) + lVar47;
          auVar100 = *(undefined1 (*) [16])(lVar10 + lVar45 * lVar9);
          uVar50 = 0;
          if (-1 < (short)uVar5) {
            uVar50 = uVar53;
          }
          auVar101 = *(undefined1 (*) [16])(lVar10 + (lVar16 + uVar50) * lVar9);
          auVar106 = *(undefined1 (*) [16])(lVar10 + (lVar47 + uVar50) * lVar9);
          auVar61 = *(undefined1 (*) [16])(lVar10 + lVar9 * (uVar50 + lVar45));
          lVar8 = *(long *)(lVar8 + 0x38 + lVar55);
          uVar46 = *(undefined4 *)(local_10e0 + local_1610 * 4);
          auVar190._4_4_ = uVar46;
          auVar190._0_4_ = uVar46;
          auVar190._8_4_ = uVar46;
          auVar190._12_4_ = uVar46;
          auVar71 = vsubps_avx(*(undefined1 (*) [16])(lVar8 + lVar11 * uVar49),auVar59);
          auVar71 = vfmadd213ps_fma(auVar71,auVar190,auVar59);
          auVar59 = vsubps_avx(*(undefined1 (*) [16])(lVar8 + lVar11 * (uVar49 + 1)),auVar58);
          auVar88 = vfmadd213ps_fma(auVar59,auVar190,auVar58);
          auVar59 = vsubps_avx(*(undefined1 (*) [16])(lVar8 + lVar11 * lVar16),auVar86);
          auVar107 = vfmadd213ps_fma(auVar59,auVar190,auVar86);
          auVar59 = vsubps_avx(*(undefined1 (*) [16])(lVar8 + lVar11 * lVar47),auVar87);
          auVar73 = vfmadd213ps_fma(auVar59,auVar190,auVar87);
          auVar59 = vsubps_avx(*(undefined1 (*) [16])(lVar8 + lVar11 * lVar42),auVar57);
          auVar58 = vfmadd213ps_fma(auVar59,auVar190,auVar57);
          auVar59 = vsubps_avx(*(undefined1 (*) [16])(lVar8 + lVar11 * lVar45),auVar100);
          auVar60 = vfmadd213ps_fma(auVar59,auVar190,auVar100);
          auVar59 = vsubps_avx(*(undefined1 (*) [16])(lVar8 + lVar11 * (lVar16 + uVar50)),auVar101);
          auVar72 = vfmadd213ps_fma(auVar59,auVar190,auVar101);
          auVar59 = vsubps_avx(*(undefined1 (*) [16])(lVar8 + lVar11 * (lVar47 + uVar50)),auVar106);
          auVar89 = vfmadd213ps_fma(auVar59,auVar190,auVar106);
          auVar59 = vsubps_avx(*(undefined1 (*) [16])(lVar8 + (uVar50 + lVar45) * lVar11),auVar61);
          auVar61 = vfmadd213ps_fma(auVar59,auVar190,auVar61);
          auVar86 = vunpcklps_avx(auVar88,auVar60);
          auVar59 = vunpckhps_avx(auVar88,auVar60);
          auVar57 = vunpcklps_avx(auVar58,auVar73);
          auVar58 = vunpckhps_avx(auVar58,auVar73);
          auVar87 = vunpcklps_avx(auVar59,auVar58);
          auVar100 = vunpcklps_avx(auVar86,auVar57);
          auVar59 = vunpckhps_avx(auVar86,auVar57);
          auVar57 = vunpcklps_avx(auVar107,auVar89);
          auVar58 = vunpckhps_avx(auVar107,auVar89);
          auVar101 = vunpcklps_avx(auVar73,auVar72);
          auVar86 = vunpckhps_avx(auVar73,auVar72);
          auVar86 = vunpcklps_avx(auVar58,auVar86);
          auVar106 = vunpcklps_avx(auVar57,auVar101);
          auVar58 = vunpckhps_avx(auVar57,auVar101);
          auVar118._16_16_ = auVar89;
          auVar118._0_16_ = auVar107;
          auVar76._16_16_ = auVar60;
          auVar76._0_16_ = auVar88;
          auVar63 = vunpcklps_avx(auVar76,auVar118);
          auVar133._16_16_ = auVar73;
          auVar133._0_16_ = auVar71;
          auVar66._16_16_ = auVar61;
          auVar66._0_16_ = auVar73;
          auVar64 = vunpcklps_avx(auVar133,auVar66);
          auVar15 = vunpcklps_avx(auVar64,auVar63);
          auVar63 = vunpckhps_avx(auVar64,auVar63);
          auVar64 = vunpckhps_avx(auVar76,auVar118);
          auVar74 = vunpckhps_avx(auVar133,auVar66);
          auVar64 = vunpcklps_avx(auVar74,auVar64);
          auVar77._16_16_ = auVar100;
          auVar77._0_16_ = auVar100;
          auVar110._16_16_ = auVar59;
          auVar110._0_16_ = auVar59;
          auVar119._16_16_ = auVar87;
          auVar119._0_16_ = auVar87;
          auVar127._16_16_ = auVar106;
          auVar127._0_16_ = auVar106;
          auVar134._16_16_ = auVar58;
          auVar134._0_16_ = auVar58;
          uVar46 = *(undefined4 *)(local_1608 + local_1610 * 4);
          auVar140._4_4_ = uVar46;
          auVar140._0_4_ = uVar46;
          auVar140._8_4_ = uVar46;
          auVar140._12_4_ = uVar46;
          auVar140._16_4_ = uVar46;
          auVar140._20_4_ = uVar46;
          auVar140._24_4_ = uVar46;
          auVar140._28_4_ = uVar46;
          uVar46 = *(undefined4 *)(local_1608 + local_1610 * 4 + 0x20);
          auVar144._4_4_ = uVar46;
          auVar144._0_4_ = uVar46;
          auVar144._8_4_ = uVar46;
          auVar144._12_4_ = uVar46;
          auVar144._16_4_ = uVar46;
          auVar144._20_4_ = uVar46;
          auVar144._24_4_ = uVar46;
          auVar144._28_4_ = uVar46;
          auVar103._16_16_ = auVar86;
          auVar103._0_16_ = auVar86;
          uVar46 = *(undefined4 *)(local_1608 + local_1610 * 4 + 0x40);
          auVar150._4_4_ = uVar46;
          auVar150._0_4_ = uVar46;
          auVar150._8_4_ = uVar46;
          auVar150._12_4_ = uVar46;
          auVar150._16_4_ = uVar46;
          auVar150._20_4_ = uVar46;
          auVar150._24_4_ = uVar46;
          auVar150._28_4_ = uVar46;
          auVar15 = vsubps_avx(auVar15,auVar140);
          local_1480 = vsubps_avx(auVar63,auVar144);
          local_1560 = vsubps_avx(auVar64,auVar150);
          auVar63 = vsubps_avx(auVar77,auVar140);
          auVar64 = vsubps_avx(auVar110,auVar144);
          auVar74 = vsubps_avx(auVar119,auVar150);
          auVar65 = vsubps_avx(auVar127,auVar140);
          auVar75 = vsubps_avx(auVar134,auVar144);
          auVar91 = vsubps_avx(auVar103,auVar150);
          local_1120 = vsubps_avx(auVar65,auVar15);
          local_1160 = vsubps_avx(auVar75,local_1480);
          local_1140 = vsubps_avx(auVar91,local_1560);
          auVar67._0_4_ = auVar15._0_4_ + auVar65._0_4_;
          auVar67._4_4_ = auVar15._4_4_ + auVar65._4_4_;
          auVar67._8_4_ = auVar15._8_4_ + auVar65._8_4_;
          auVar67._12_4_ = auVar15._12_4_ + auVar65._12_4_;
          auVar67._16_4_ = auVar15._16_4_ + auVar65._16_4_;
          auVar67._20_4_ = auVar15._20_4_ + auVar65._20_4_;
          auVar67._24_4_ = auVar15._24_4_ + auVar65._24_4_;
          auVar67._28_4_ = auVar15._28_4_ + auVar65._28_4_;
          auVar104._0_4_ = auVar75._0_4_ + local_1480._0_4_;
          auVar104._4_4_ = auVar75._4_4_ + local_1480._4_4_;
          auVar104._8_4_ = auVar75._8_4_ + local_1480._8_4_;
          auVar104._12_4_ = auVar75._12_4_ + local_1480._12_4_;
          auVar104._16_4_ = auVar75._16_4_ + local_1480._16_4_;
          auVar104._20_4_ = auVar75._20_4_ + local_1480._20_4_;
          auVar104._24_4_ = auVar75._24_4_ + local_1480._24_4_;
          auVar104._28_4_ = auVar75._28_4_ + local_1480._28_4_;
          fVar163 = local_1560._0_4_;
          auVar128._0_4_ = fVar163 + auVar91._0_4_;
          fVar170 = local_1560._4_4_;
          auVar128._4_4_ = fVar170 + auVar91._4_4_;
          fVar173 = local_1560._8_4_;
          auVar128._8_4_ = fVar173 + auVar91._8_4_;
          fVar176 = local_1560._12_4_;
          auVar128._12_4_ = fVar176 + auVar91._12_4_;
          fVar178 = local_1560._16_4_;
          auVar128._16_4_ = fVar178 + auVar91._16_4_;
          fVar180 = local_1560._20_4_;
          auVar128._20_4_ = fVar180 + auVar91._20_4_;
          fVar182 = local_1560._24_4_;
          auVar128._24_4_ = fVar182 + auVar91._24_4_;
          auVar128._28_4_ = local_1560._28_4_ + auVar91._28_4_;
          auVar13._4_4_ = local_1140._4_4_ * auVar104._4_4_;
          auVar13._0_4_ = local_1140._0_4_ * auVar104._0_4_;
          auVar13._8_4_ = local_1140._8_4_ * auVar104._8_4_;
          auVar13._12_4_ = local_1140._12_4_ * auVar104._12_4_;
          auVar13._16_4_ = local_1140._16_4_ * auVar104._16_4_;
          auVar13._20_4_ = local_1140._20_4_ * auVar104._20_4_;
          auVar13._24_4_ = local_1140._24_4_ * auVar104._24_4_;
          auVar13._28_4_ = auVar58._12_4_;
          auVar58 = vfmsub231ps_fma(auVar13,local_1160,auVar128);
          auVar14._4_4_ = local_1120._4_4_ * auVar128._4_4_;
          auVar14._0_4_ = local_1120._0_4_ * auVar128._0_4_;
          auVar14._8_4_ = local_1120._8_4_ * auVar128._8_4_;
          auVar14._12_4_ = local_1120._12_4_ * auVar128._12_4_;
          auVar14._16_4_ = local_1120._16_4_ * auVar128._16_4_;
          auVar14._20_4_ = local_1120._20_4_ * auVar128._20_4_;
          auVar14._24_4_ = local_1120._24_4_ * auVar128._24_4_;
          auVar14._28_4_ = auVar128._28_4_;
          auVar59 = vfmsub231ps_fma(auVar14,local_1140,auVar67);
          auVar17._4_4_ = local_1160._4_4_ * auVar67._4_4_;
          auVar17._0_4_ = local_1160._0_4_ * auVar67._0_4_;
          auVar17._8_4_ = local_1160._8_4_ * auVar67._8_4_;
          auVar17._12_4_ = local_1160._12_4_ * auVar67._12_4_;
          auVar17._16_4_ = local_1160._16_4_ * auVar67._16_4_;
          auVar17._20_4_ = local_1160._20_4_ * auVar67._20_4_;
          auVar17._24_4_ = local_1160._24_4_ * auVar67._24_4_;
          auVar17._28_4_ = auVar67._28_4_;
          auVar86 = vfmsub231ps_fma(auVar17,local_1120,auVar104);
          uVar46 = *(undefined4 *)(local_1608 + local_1610 * 4 + 0xa0);
          local_16a0._4_4_ = uVar46;
          local_16a0._0_4_ = uVar46;
          local_16a0._8_4_ = uVar46;
          local_16a0._12_4_ = uVar46;
          local_16a0._16_4_ = uVar46;
          local_16a0._20_4_ = uVar46;
          local_16a0._24_4_ = uVar46;
          local_16a0._28_4_ = uVar46;
          fVar98 = *(float *)(local_1608 + local_1610 * 4 + 0xc0);
          local_1180._4_4_ = fVar98;
          local_1180._0_4_ = fVar98;
          local_1180._8_4_ = fVar98;
          local_1180._12_4_ = fVar98;
          local_1180._16_4_ = fVar98;
          local_1180._20_4_ = fVar98;
          local_1180._24_4_ = fVar98;
          local_1180._28_4_ = fVar98;
          auVar18._4_4_ = auVar86._4_4_ * fVar98;
          auVar18._0_4_ = auVar86._0_4_ * fVar98;
          auVar18._8_4_ = auVar86._8_4_ * fVar98;
          auVar18._12_4_ = auVar86._12_4_ * fVar98;
          auVar18._16_4_ = fVar98 * 0.0;
          auVar18._20_4_ = fVar98 * 0.0;
          auVar18._24_4_ = fVar98 * 0.0;
          auVar18._28_4_ = local_1160._28_4_;
          auVar59 = vfmadd231ps_fma(auVar18,local_16a0,ZEXT1632(auVar59));
          uVar46 = *(undefined4 *)(local_1608 + local_1610 * 4 + 0x80);
          auVar105._4_4_ = uVar46;
          auVar105._0_4_ = uVar46;
          auVar105._8_4_ = uVar46;
          auVar105._12_4_ = uVar46;
          auVar105._16_4_ = uVar46;
          auVar105._20_4_ = uVar46;
          auVar105._24_4_ = uVar46;
          auVar105._28_4_ = uVar46;
          auVar59 = vfmadd231ps_fma(ZEXT1632(auVar59),auVar105,ZEXT1632(auVar58));
          local_11a0 = vsubps_avx(local_1480,auVar64);
          local_11c0 = vsubps_avx(local_1560,auVar74);
          auVar129._0_4_ = local_1480._0_4_ + auVar64._0_4_;
          auVar129._4_4_ = local_1480._4_4_ + auVar64._4_4_;
          auVar129._8_4_ = local_1480._8_4_ + auVar64._8_4_;
          auVar129._12_4_ = local_1480._12_4_ + auVar64._12_4_;
          auVar129._16_4_ = local_1480._16_4_ + auVar64._16_4_;
          auVar129._20_4_ = local_1480._20_4_ + auVar64._20_4_;
          auVar129._24_4_ = local_1480._24_4_ + auVar64._24_4_;
          fVar70 = auVar64._28_4_;
          auVar129._28_4_ = local_1480._28_4_ + fVar70;
          auVar135._0_4_ = fVar163 + auVar74._0_4_;
          auVar135._4_4_ = fVar170 + auVar74._4_4_;
          auVar135._8_4_ = fVar173 + auVar74._8_4_;
          auVar135._12_4_ = fVar176 + auVar74._12_4_;
          auVar135._16_4_ = fVar178 + auVar74._16_4_;
          auVar135._20_4_ = fVar180 + auVar74._20_4_;
          auVar135._24_4_ = fVar182 + auVar74._24_4_;
          fVar82 = auVar74._28_4_;
          auVar135._28_4_ = local_1560._28_4_ + fVar82;
          fVar85 = local_11c0._0_4_;
          fVar94 = local_11c0._4_4_;
          auVar19._4_4_ = auVar129._4_4_ * fVar94;
          auVar19._0_4_ = auVar129._0_4_ * fVar85;
          fVar96 = local_11c0._8_4_;
          auVar19._8_4_ = auVar129._8_4_ * fVar96;
          fVar99 = local_11c0._12_4_;
          auVar19._12_4_ = auVar129._12_4_ * fVar99;
          fVar161 = local_11c0._16_4_;
          auVar19._16_4_ = auVar129._16_4_ * fVar161;
          fVar169 = local_11c0._20_4_;
          auVar19._20_4_ = auVar129._20_4_ * fVar169;
          fVar175 = local_11c0._24_4_;
          auVar19._24_4_ = auVar129._24_4_ * fVar175;
          auVar19._28_4_ = fVar82;
          auVar86 = vfmsub231ps_fma(auVar19,local_11a0,auVar135);
          auVar13 = vsubps_avx(auVar15,auVar63);
          fVar164 = auVar13._0_4_;
          fVar171 = auVar13._4_4_;
          auVar20._4_4_ = fVar171 * auVar135._4_4_;
          auVar20._0_4_ = fVar164 * auVar135._0_4_;
          fVar174 = auVar13._8_4_;
          auVar20._8_4_ = fVar174 * auVar135._8_4_;
          fVar177 = auVar13._12_4_;
          auVar20._12_4_ = fVar177 * auVar135._12_4_;
          fVar179 = auVar13._16_4_;
          auVar20._16_4_ = fVar179 * auVar135._16_4_;
          fVar181 = auVar13._20_4_;
          auVar20._20_4_ = fVar181 * auVar135._20_4_;
          fVar183 = auVar13._24_4_;
          auVar20._24_4_ = fVar183 * auVar135._24_4_;
          auVar20._28_4_ = local_1140._28_4_;
          auVar136._0_4_ = auVar15._0_4_ + auVar63._0_4_;
          auVar136._4_4_ = auVar15._4_4_ + auVar63._4_4_;
          auVar136._8_4_ = auVar15._8_4_ + auVar63._8_4_;
          auVar136._12_4_ = auVar15._12_4_ + auVar63._12_4_;
          auVar136._16_4_ = auVar15._16_4_ + auVar63._16_4_;
          auVar136._20_4_ = auVar15._20_4_ + auVar63._20_4_;
          auVar136._24_4_ = auVar15._24_4_ + auVar63._24_4_;
          auVar136._28_4_ = auVar15._28_4_ + auVar63._28_4_;
          auVar58 = vfmsub231ps_fma(auVar20,local_11c0,auVar136);
          fVar93 = local_11a0._0_4_;
          fVar95 = local_11a0._4_4_;
          auVar21._4_4_ = auVar136._4_4_ * fVar95;
          auVar21._0_4_ = auVar136._0_4_ * fVar93;
          fVar97 = local_11a0._8_4_;
          auVar21._8_4_ = auVar136._8_4_ * fVar97;
          fVar160 = local_11a0._12_4_;
          auVar21._12_4_ = auVar136._12_4_ * fVar160;
          fVar162 = local_11a0._16_4_;
          auVar21._16_4_ = auVar136._16_4_ * fVar162;
          fVar172 = local_11a0._20_4_;
          auVar21._20_4_ = auVar136._20_4_ * fVar172;
          fVar184 = local_11a0._24_4_;
          auVar21._24_4_ = auVar136._24_4_ * fVar184;
          auVar21._28_4_ = auVar136._28_4_;
          auVar57 = vfmsub231ps_fma(auVar21,auVar13,auVar129);
          auVar22._4_4_ = auVar57._4_4_ * fVar98;
          auVar22._0_4_ = auVar57._0_4_ * fVar98;
          auVar22._8_4_ = auVar57._8_4_ * fVar98;
          auVar22._12_4_ = auVar57._12_4_ * fVar98;
          auVar22._16_4_ = fVar98 * 0.0;
          auVar22._20_4_ = fVar98 * 0.0;
          auVar22._24_4_ = fVar98 * 0.0;
          auVar22._28_4_ = auVar13._28_4_;
          auVar58 = vfmadd231ps_fma(auVar22,local_16a0,ZEXT1632(auVar58));
          auVar58 = vfmadd231ps_fma(ZEXT1632(auVar58),auVar105,ZEXT1632(auVar86));
          auVar14 = vsubps_avx(auVar63,auVar65);
          auVar120._0_4_ = auVar63._0_4_ + auVar65._0_4_;
          auVar120._4_4_ = auVar63._4_4_ + auVar65._4_4_;
          auVar120._8_4_ = auVar63._8_4_ + auVar65._8_4_;
          auVar120._12_4_ = auVar63._12_4_ + auVar65._12_4_;
          auVar120._16_4_ = auVar63._16_4_ + auVar65._16_4_;
          auVar120._20_4_ = auVar63._20_4_ + auVar65._20_4_;
          auVar120._24_4_ = auVar63._24_4_ + auVar65._24_4_;
          auVar120._28_4_ = auVar63._28_4_ + auVar65._28_4_;
          auVar65 = vsubps_avx(auVar64,auVar75);
          auVar141._0_4_ = auVar75._0_4_ + auVar64._0_4_;
          auVar141._4_4_ = auVar75._4_4_ + auVar64._4_4_;
          auVar141._8_4_ = auVar75._8_4_ + auVar64._8_4_;
          auVar141._12_4_ = auVar75._12_4_ + auVar64._12_4_;
          auVar141._16_4_ = auVar75._16_4_ + auVar64._16_4_;
          auVar141._20_4_ = auVar75._20_4_ + auVar64._20_4_;
          auVar141._24_4_ = auVar75._24_4_ + auVar64._24_4_;
          auVar141._28_4_ = auVar75._28_4_ + fVar70;
          auVar75 = vsubps_avx(auVar74,auVar91);
          auVar78._0_4_ = auVar74._0_4_ + auVar91._0_4_;
          auVar78._4_4_ = auVar74._4_4_ + auVar91._4_4_;
          auVar78._8_4_ = auVar74._8_4_ + auVar91._8_4_;
          auVar78._12_4_ = auVar74._12_4_ + auVar91._12_4_;
          auVar78._16_4_ = auVar74._16_4_ + auVar91._16_4_;
          auVar78._20_4_ = auVar74._20_4_ + auVar91._20_4_;
          auVar78._24_4_ = auVar74._24_4_ + auVar91._24_4_;
          auVar78._28_4_ = fVar82 + auVar91._28_4_;
          auVar23._4_4_ = auVar141._4_4_ * auVar75._4_4_;
          auVar23._0_4_ = auVar141._0_4_ * auVar75._0_4_;
          auVar23._8_4_ = auVar141._8_4_ * auVar75._8_4_;
          auVar23._12_4_ = auVar141._12_4_ * auVar75._12_4_;
          auVar23._16_4_ = auVar141._16_4_ * auVar75._16_4_;
          auVar23._20_4_ = auVar141._20_4_ * auVar75._20_4_;
          auVar23._24_4_ = auVar141._24_4_ * auVar75._24_4_;
          auVar23._28_4_ = fVar70;
          auVar57 = vfmsub231ps_fma(auVar23,auVar65,auVar78);
          auVar24._4_4_ = auVar78._4_4_ * auVar14._4_4_;
          auVar24._0_4_ = auVar78._0_4_ * auVar14._0_4_;
          auVar24._8_4_ = auVar78._8_4_ * auVar14._8_4_;
          auVar24._12_4_ = auVar78._12_4_ * auVar14._12_4_;
          auVar24._16_4_ = auVar78._16_4_ * auVar14._16_4_;
          auVar24._20_4_ = auVar78._20_4_ * auVar14._20_4_;
          auVar24._24_4_ = auVar78._24_4_ * auVar14._24_4_;
          auVar24._28_4_ = auVar78._28_4_;
          auVar86 = vfmsub231ps_fma(auVar24,auVar75,auVar120);
          auVar25._4_4_ = auVar120._4_4_ * auVar65._4_4_;
          auVar25._0_4_ = auVar120._0_4_ * auVar65._0_4_;
          auVar25._8_4_ = auVar120._8_4_ * auVar65._8_4_;
          auVar25._12_4_ = auVar120._12_4_ * auVar65._12_4_;
          auVar25._16_4_ = auVar120._16_4_ * auVar65._16_4_;
          auVar25._20_4_ = auVar120._20_4_ * auVar65._20_4_;
          auVar25._24_4_ = auVar120._24_4_ * auVar65._24_4_;
          auVar25._28_4_ = auVar120._28_4_;
          auVar87 = vfmsub231ps_fma(auVar25,auVar14,auVar141);
          auVar121._0_4_ = auVar87._0_4_ * fVar98;
          auVar121._4_4_ = auVar87._4_4_ * fVar98;
          auVar121._8_4_ = auVar87._8_4_ * fVar98;
          auVar121._12_4_ = auVar87._12_4_ * fVar98;
          auVar121._16_4_ = fVar98 * 0.0;
          auVar121._20_4_ = fVar98 * 0.0;
          auVar121._24_4_ = fVar98 * 0.0;
          auVar121._28_4_ = 0;
          auVar86 = vfmadd231ps_fma(auVar121,local_16a0,ZEXT1632(auVar86));
          auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar105,ZEXT1632(auVar57));
          fVar70 = auVar86._0_4_ + auVar59._0_4_ + auVar58._0_4_;
          fVar82 = auVar86._4_4_ + auVar59._4_4_ + auVar58._4_4_;
          fVar83 = auVar86._8_4_ + auVar59._8_4_ + auVar58._8_4_;
          fVar84 = auVar86._12_4_ + auVar59._12_4_ + auVar58._12_4_;
          local_11e0 = ZEXT1632(CONCAT412(fVar84,CONCAT48(fVar83,CONCAT44(fVar82,fVar70))));
          auVar111._8_4_ = 0x7fffffff;
          auVar111._0_8_ = 0x7fffffff7fffffff;
          auVar111._12_4_ = 0x7fffffff;
          auVar111._16_4_ = 0x7fffffff;
          auVar111._20_4_ = 0x7fffffff;
          auVar111._24_4_ = 0x7fffffff;
          auVar111._28_4_ = 0x7fffffff;
          local_1200 = ZEXT1632(auVar59);
          auVar63 = vminps_avx(local_1200,ZEXT1632(auVar58));
          auVar63 = vminps_avx(auVar63,ZEXT1632(auVar86));
          local_1220 = vandps_avx(local_11e0,auVar111);
          fVar147 = local_1220._0_4_ * 1.1920929e-07;
          fVar152 = local_1220._4_4_ * 1.1920929e-07;
          auVar26._4_4_ = fVar152;
          auVar26._0_4_ = fVar147;
          fVar153 = local_1220._8_4_ * 1.1920929e-07;
          auVar26._8_4_ = fVar153;
          fVar154 = local_1220._12_4_ * 1.1920929e-07;
          auVar26._12_4_ = fVar154;
          fVar155 = local_1220._16_4_ * 1.1920929e-07;
          auVar26._16_4_ = fVar155;
          fVar156 = local_1220._20_4_ * 1.1920929e-07;
          auVar26._20_4_ = fVar156;
          fVar157 = local_1220._24_4_ * 1.1920929e-07;
          auVar26._24_4_ = fVar157;
          auVar26._28_4_ = 0x34000000;
          auVar145._0_8_ = CONCAT44(fVar152,fVar147) ^ 0x8000000080000000;
          auVar145._8_4_ = -fVar153;
          auVar145._12_4_ = -fVar154;
          auVar145._16_4_ = -fVar155;
          auVar145._20_4_ = -fVar156;
          auVar145._24_4_ = -fVar157;
          auVar145._28_4_ = 0xb4000000;
          auVar63 = vcmpps_avx(auVar63,auVar145,5);
          auVar91 = ZEXT1632(auVar58);
          auVar74 = vmaxps_avx(local_1200,auVar91);
          auVar64 = vmaxps_avx(auVar74,ZEXT1632(auVar86));
          auVar64 = vcmpps_avx(auVar64,auVar26,2);
          auVar64 = vorps_avx(auVar63,auVar64);
          if ((((((((auVar64 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar64 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar64 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar64 >> 0x7f,0) != '\0') ||
                (auVar64 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar64 >> 0xbf,0) != '\0') ||
              (auVar64 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar64[0x1f] < '\0') {
            auVar27._4_4_ = fVar95 * local_1140._4_4_;
            auVar27._0_4_ = fVar93 * local_1140._0_4_;
            auVar27._8_4_ = fVar97 * local_1140._8_4_;
            auVar27._12_4_ = fVar160 * local_1140._12_4_;
            auVar27._16_4_ = fVar162 * local_1140._16_4_;
            auVar27._20_4_ = fVar172 * local_1140._20_4_;
            auVar27._24_4_ = fVar184 * local_1140._24_4_;
            auVar27._28_4_ = auVar63._28_4_;
            auVar28._4_4_ = fVar171 * local_1160._4_4_;
            auVar28._0_4_ = fVar164 * local_1160._0_4_;
            auVar28._8_4_ = fVar174 * local_1160._8_4_;
            auVar28._12_4_ = fVar177 * local_1160._12_4_;
            auVar28._16_4_ = fVar179 * local_1160._16_4_;
            auVar28._20_4_ = fVar181 * local_1160._20_4_;
            auVar28._24_4_ = fVar183 * local_1160._24_4_;
            auVar28._28_4_ = auVar74._28_4_;
            auVar59 = vfmsub213ps_fma(local_1160,local_11c0,auVar27);
            auVar29._4_4_ = auVar65._4_4_ * fVar94;
            auVar29._0_4_ = auVar65._0_4_ * fVar85;
            auVar29._8_4_ = auVar65._8_4_ * fVar96;
            auVar29._12_4_ = auVar65._12_4_ * fVar99;
            auVar29._16_4_ = auVar65._16_4_ * fVar161;
            auVar29._20_4_ = auVar65._20_4_ * fVar169;
            auVar29._24_4_ = auVar65._24_4_ * fVar175;
            auVar29._28_4_ = 0x34000000;
            auVar30._4_4_ = fVar171 * auVar75._4_4_;
            auVar30._0_4_ = fVar164 * auVar75._0_4_;
            auVar30._8_4_ = fVar174 * auVar75._8_4_;
            auVar30._12_4_ = fVar177 * auVar75._12_4_;
            auVar30._16_4_ = fVar179 * auVar75._16_4_;
            auVar30._20_4_ = fVar181 * auVar75._20_4_;
            auVar30._24_4_ = fVar183 * auVar75._24_4_;
            auVar30._28_4_ = local_1220._28_4_;
            auVar86 = vfmsub213ps_fma(auVar75,local_11a0,auVar29);
            auVar63 = vandps_avx(auVar27,auVar111);
            auVar74 = vandps_avx(auVar29,auVar111);
            auVar63 = vcmpps_avx(auVar63,auVar74,1);
            auVar75 = vblendvps_avx(ZEXT1632(auVar86),ZEXT1632(auVar59),auVar63);
            auVar31._4_4_ = auVar14._4_4_ * fVar95;
            auVar31._0_4_ = auVar14._0_4_ * fVar93;
            auVar31._8_4_ = auVar14._8_4_ * fVar97;
            auVar31._12_4_ = auVar14._12_4_ * fVar160;
            auVar31._16_4_ = auVar14._16_4_ * fVar162;
            auVar31._20_4_ = auVar14._20_4_ * fVar172;
            auVar31._24_4_ = auVar14._24_4_ * fVar184;
            auVar31._28_4_ = auVar74._28_4_;
            auVar59 = vfmsub213ps_fma(auVar14,local_11c0,auVar30);
            auVar32._4_4_ = local_1120._4_4_ * fVar94;
            auVar32._0_4_ = local_1120._0_4_ * fVar85;
            auVar32._8_4_ = local_1120._8_4_ * fVar96;
            auVar32._12_4_ = local_1120._12_4_ * fVar99;
            auVar32._16_4_ = local_1120._16_4_ * fVar161;
            auVar32._20_4_ = local_1120._20_4_ * fVar169;
            auVar32._24_4_ = local_1120._24_4_ * fVar175;
            auVar32._28_4_ = local_11c0._28_4_;
            auVar86 = vfmsub213ps_fma(local_1140,auVar13,auVar32);
            auVar63 = vandps_avx(auVar32,auVar111);
            auVar74 = vandps_avx(auVar30,auVar111);
            auVar63 = vcmpps_avx(auVar63,auVar74,1);
            auVar14 = vblendvps_avx(ZEXT1632(auVar59),ZEXT1632(auVar86),auVar63);
            auVar59 = vfmsub213ps_fma(local_1120,local_11a0,auVar28);
            auVar86 = vfmsub213ps_fma(auVar65,auVar13,auVar31);
            auVar63 = vandps_avx(auVar28,auVar111);
            auVar74 = vandps_avx(auVar31,auVar111);
            auVar63 = vcmpps_avx(auVar63,auVar74,1);
            auVar74 = vblendvps_avx(ZEXT1632(auVar86),ZEXT1632(auVar59),auVar63);
            auVar59 = vpackssdw_avx(auVar64._0_16_,auVar64._16_16_);
            fVar85 = auVar74._0_4_;
            auVar68._0_4_ = fVar85 * fVar98;
            fVar93 = auVar74._4_4_;
            auVar68._4_4_ = fVar93 * fVar98;
            fVar94 = auVar74._8_4_;
            auVar68._8_4_ = fVar94 * fVar98;
            fVar95 = auVar74._12_4_;
            auVar68._12_4_ = fVar95 * fVar98;
            fVar96 = auVar74._16_4_;
            auVar68._16_4_ = fVar96 * fVar98;
            fVar97 = auVar74._20_4_;
            auVar68._20_4_ = fVar97 * fVar98;
            fVar99 = auVar74._24_4_;
            auVar68._24_4_ = fVar99 * fVar98;
            auVar68._28_4_ = 0;
            auVar86 = vfmadd213ps_fma(local_16a0,auVar14,auVar68);
            auVar86 = vfmadd213ps_fma(auVar105,auVar75,ZEXT1632(auVar86));
            auVar65 = ZEXT1632(CONCAT412(auVar86._12_4_ + auVar86._12_4_,
                                         CONCAT48(auVar86._8_4_ + auVar86._8_4_,
                                                  CONCAT44(auVar86._4_4_ + auVar86._4_4_,
                                                           auVar86._0_4_ + auVar86._0_4_))));
            auVar33._4_4_ = fVar93 * fVar170;
            auVar33._0_4_ = fVar85 * fVar163;
            auVar33._8_4_ = fVar94 * fVar173;
            auVar33._12_4_ = fVar95 * fVar176;
            auVar33._16_4_ = fVar96 * fVar178;
            auVar33._20_4_ = fVar97 * fVar180;
            auVar33._24_4_ = fVar99 * fVar182;
            auVar33._28_4_ = auVar64._28_4_;
            auVar86 = vfmadd213ps_fma(local_1480,auVar14,auVar33);
            auVar57 = vfmadd213ps_fma(auVar15,auVar75,ZEXT1632(auVar86));
            auVar63 = vrcpps_avx(auVar65);
            auVar151._8_4_ = 0x3f800000;
            auVar151._0_8_ = 0x3f8000003f800000;
            auVar151._12_4_ = 0x3f800000;
            auVar151._16_4_ = 0x3f800000;
            auVar151._20_4_ = 0x3f800000;
            auVar151._24_4_ = 0x3f800000;
            auVar151._28_4_ = 0x3f800000;
            auVar86 = vfnmadd213ps_fma(auVar63,auVar65,auVar151);
            auVar86 = vfmadd132ps_fma(ZEXT1632(auVar86),auVar63,auVar63);
            local_15c0._28_4_ = 0x3f800000;
            local_15c0._0_28_ =
                 ZEXT1628(CONCAT412(auVar86._12_4_ * (auVar57._12_4_ + auVar57._12_4_),
                                    CONCAT48(auVar86._8_4_ * (auVar57._8_4_ + auVar57._8_4_),
                                             CONCAT44(auVar86._4_4_ *
                                                      (auVar57._4_4_ + auVar57._4_4_),
                                                      auVar86._0_4_ *
                                                      (auVar57._0_4_ + auVar57._0_4_)))));
            auVar124 = ZEXT3264(local_15c0);
            uVar46 = *(undefined4 *)(local_1608 + local_1610 * 4 + 0x60);
            auVar122._4_4_ = uVar46;
            auVar122._0_4_ = uVar46;
            auVar122._8_4_ = uVar46;
            auVar122._12_4_ = uVar46;
            auVar122._16_4_ = uVar46;
            auVar122._20_4_ = uVar46;
            auVar122._24_4_ = uVar46;
            auVar122._28_4_ = uVar46;
            auVar63 = vcmpps_avx(auVar122,local_15c0,2);
            auVar146._4_4_ = fVar1;
            auVar146._0_4_ = fVar1;
            auVar146._8_4_ = fVar1;
            auVar146._12_4_ = fVar1;
            auVar146._16_4_ = fVar1;
            auVar146._20_4_ = fVar1;
            auVar146._24_4_ = fVar1;
            auVar146._28_4_ = fVar1;
            auVar64 = vcmpps_avx(local_15c0,auVar146,2);
            auVar63 = vandps_avx(auVar64,auVar63);
            auVar86 = vpackssdw_avx(auVar63._0_16_,auVar63._16_16_);
            auVar59 = vpand_avx(auVar86,auVar59);
            auVar63 = vpmovsxwd_avx2(auVar59);
            if ((((((((auVar63 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar63 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar63 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar63 >> 0x7f,0) != '\0') ||
                  (auVar63 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar63 >> 0xbf,0) != '\0') ||
                (auVar63 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar63[0x1f] < '\0') {
              auVar63 = vcmpps_avx(auVar65,_DAT_01f7b000,4);
              auVar86 = vpackssdw_avx(auVar63._0_16_,auVar63._16_16_);
              auVar59 = vpand_avx(auVar59,auVar86);
              local_1360 = vpmovsxwd_avx2(auVar59);
              if ((((((((local_1360 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (local_1360 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_1360 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_1360 >> 0x7f,0) != '\0') ||
                    (local_1360 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(local_1360 >> 0xbf,0) != '\0') ||
                  (local_1360 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  local_1360[0x1f] < '\0') {
                local_13a0 = local_11e0;
                local_1380 = &local_16b1;
                auVar63 = vsubps_avx(local_11e0,auVar91);
                auVar63 = vblendvps_avx(local_1200,auVar63,local_1260);
                auVar64 = vsubps_avx(local_11e0,local_1200);
                local_13c0 = vblendvps_avx(auVar91,auVar64,local_1260);
                local_1300 = local_15c0;
                local_12e0[0] = auVar75._0_4_ * (float)local_1280._0_4_;
                local_12e0[1] = auVar75._4_4_ * (float)local_1280._4_4_;
                local_12e0[2] = auVar75._8_4_ * fStack_1278;
                local_12e0[3] = auVar75._12_4_ * fStack_1274;
                fStack_12d0 = auVar75._16_4_ * fStack_1270;
                fStack_12cc = auVar75._20_4_ * fStack_126c;
                fStack_12c8 = auVar75._24_4_ * fStack_1268;
                uStack_12c4 = local_1260._28_4_;
                local_12c0[0] = (float)local_1280._0_4_ * auVar14._0_4_;
                local_12c0[1] = (float)local_1280._4_4_ * auVar14._4_4_;
                local_12c0[2] = fStack_1278 * auVar14._8_4_;
                local_12c0[3] = fStack_1274 * auVar14._12_4_;
                fStack_12b0 = fStack_1270 * auVar14._16_4_;
                fStack_12ac = fStack_126c * auVar14._20_4_;
                fStack_12a8 = fStack_1268 * auVar14._24_4_;
                uStack_12a4 = local_1260._28_4_;
                local_12a0[0] = (float)local_1280._0_4_ * fVar85;
                local_12a0[1] = (float)local_1280._4_4_ * fVar93;
                local_12a0[2] = fStack_1278 * fVar94;
                local_12a0[3] = fStack_1274 * fVar95;
                fStack_1290 = fStack_1270 * fVar96;
                fStack_128c = fStack_126c * fVar97;
                fStack_1288 = fStack_1268 * fVar99;
                uStack_1284 = auVar74._28_4_;
                auVar92._0_8_ = (ulong)CONCAT24(uVar4,(uint)uVar4) & 0x7fff00007fff;
                auVar92._8_4_ = local_16a4;
                auVar92._12_4_ = local_16a4;
                auVar92._16_4_ = local_16a4;
                auVar92._20_4_ = local_16a4;
                auVar92._24_4_ = local_16a4;
                auVar92._28_4_ = local_16a4;
                auVar64 = vpaddd_avx2(auVar92,_DAT_01fb7740);
                auVar116._0_4_ = (float)(int)(*(ushort *)(local_15e0 + 8 + local_15e8) - 1);
                auVar116._4_12_ = auVar58._4_12_;
                auVar59 = vrcpss_avx(auVar116,auVar116);
                auVar86 = vfnmadd213ss_fma(auVar59,auVar116,ZEXT416(0x40000000));
                fVar98 = auVar59._0_4_ * auVar86._0_4_;
                auVar64 = vcvtdq2ps_avx(auVar64);
                fVar99 = auVar64._28_4_ + auVar63._28_4_;
                fVar85 = (fVar70 * auVar64._0_4_ + auVar63._0_4_) * fVar98;
                fVar93 = (fVar82 * auVar64._4_4_ + auVar63._4_4_) * fVar98;
                local_13e0._4_4_ = fVar93;
                local_13e0._0_4_ = fVar85;
                fVar94 = (fVar83 * auVar64._8_4_ + auVar63._8_4_) * fVar98;
                local_13e0._8_4_ = fVar94;
                fVar95 = (fVar84 * auVar64._12_4_ + auVar63._12_4_) * fVar98;
                local_13e0._12_4_ = fVar95;
                fVar96 = (auVar64._16_4_ * 0.0 + auVar63._16_4_) * fVar98;
                local_13e0._16_4_ = fVar96;
                fVar97 = (auVar64._20_4_ * 0.0 + auVar63._20_4_) * fVar98;
                local_13e0._20_4_ = fVar97;
                fVar98 = (auVar64._24_4_ * 0.0 + auVar63._24_4_) * fVar98;
                local_13e0._24_4_ = fVar98;
                local_13e0._28_4_ = fVar99;
                pGVar7 = (local_15d8->geometries).items[uStack_1458].ptr;
                if ((pGVar7->mask & *(uint *)(local_1608 + local_1610 * 4 + 0x120)) != 0) {
                  auVar112._0_8_ = (ulong)CONCAT24(uVar5,(uint)uVar5) & 0x7fff00007fff;
                  auVar112._8_4_ = local_16a8;
                  auVar112._12_4_ = local_16a8;
                  auVar112._16_4_ = local_16a8;
                  auVar112._20_4_ = local_16a8;
                  auVar112._24_4_ = local_16a8;
                  auVar112._28_4_ = local_16a8;
                  auVar63 = vpaddd_avx2(auVar112,_DAT_01fb7760);
                  auVar64 = vcvtdq2ps_avx(auVar63);
                  auVar117._0_4_ = (float)(int)(*(ushort *)(local_15e0 + 10 + local_15e8) - 1);
                  auVar117._4_12_ = auVar58._4_12_;
                  auVar59 = vrcpss_avx(auVar117,auVar117);
                  auVar58 = vfnmadd213ss_fma(auVar59,auVar117,ZEXT416(0x40000000));
                  fVar160 = auVar59._0_4_ * auVar58._0_4_;
                  auVar63 = vrcpps_avx(local_11e0);
                  auVar123._8_4_ = 0x3f800000;
                  auVar123._0_8_ = 0x3f8000003f800000;
                  auVar123._12_4_ = 0x3f800000;
                  auVar123._16_4_ = 0x3f800000;
                  auVar123._20_4_ = 0x3f800000;
                  auVar123._24_4_ = 0x3f800000;
                  auVar123._28_4_ = 0x3f800000;
                  auVar59 = vfnmadd213ps_fma(local_11e0,auVar63,auVar123);
                  auVar59 = vfmadd132ps_fma(ZEXT1632(auVar59),auVar63,auVar63);
                  auVar113._8_4_ = 0x219392ef;
                  auVar113._0_8_ = 0x219392ef219392ef;
                  auVar113._12_4_ = 0x219392ef;
                  auVar113._16_4_ = 0x219392ef;
                  auVar113._20_4_ = 0x219392ef;
                  auVar113._24_4_ = 0x219392ef;
                  auVar113._28_4_ = 0x219392ef;
                  auVar63 = vcmpps_avx(local_1220,auVar113,5);
                  auVar63 = vandps_avx(auVar63,ZEXT1632(auVar59));
                  auVar34._4_4_ = fVar93 * auVar63._4_4_;
                  auVar34._0_4_ = fVar85 * auVar63._0_4_;
                  auVar34._8_4_ = fVar94 * auVar63._8_4_;
                  auVar34._12_4_ = fVar95 * auVar63._12_4_;
                  auVar34._16_4_ = fVar96 * auVar63._16_4_;
                  auVar34._20_4_ = fVar97 * auVar63._20_4_;
                  auVar34._24_4_ = fVar98 * auVar63._24_4_;
                  auVar34._28_4_ = fVar99;
                  local_1340 = vminps_avx(auVar34,auVar123);
                  auVar35._4_4_ =
                       (fVar82 * auVar64._4_4_ + local_13c0._4_4_) * fVar160 * auVar63._4_4_;
                  auVar35._0_4_ =
                       (fVar70 * auVar64._0_4_ + local_13c0._0_4_) * fVar160 * auVar63._0_4_;
                  auVar35._8_4_ =
                       (fVar83 * auVar64._8_4_ + local_13c0._8_4_) * fVar160 * auVar63._8_4_;
                  auVar35._12_4_ =
                       (fVar84 * auVar64._12_4_ + local_13c0._12_4_) * fVar160 * auVar63._12_4_;
                  auVar35._16_4_ =
                       (auVar64._16_4_ * 0.0 + local_13c0._16_4_) * fVar160 * auVar63._16_4_;
                  auVar35._20_4_ =
                       (auVar64._20_4_ * 0.0 + local_13c0._20_4_) * fVar160 * auVar63._20_4_;
                  auVar35._24_4_ =
                       (auVar64._24_4_ * 0.0 + local_13c0._24_4_) * fVar160 * auVar63._24_4_;
                  auVar35._28_4_ = auVar63._28_4_;
                  local_1320 = vminps_avx(auVar35,auVar123);
                  auVar79._8_4_ = 0x7f800000;
                  auVar79._0_8_ = 0x7f8000007f800000;
                  auVar79._12_4_ = 0x7f800000;
                  auVar79._16_4_ = 0x7f800000;
                  auVar79._20_4_ = 0x7f800000;
                  auVar79._24_4_ = 0x7f800000;
                  auVar79._28_4_ = 0x7f800000;
                  auVar63 = vblendvps_avx(auVar79,local_15c0,local_1360);
                  auVar64 = vshufps_avx(auVar63,auVar63,0xb1);
                  auVar64 = vminps_avx(auVar63,auVar64);
                  auVar74 = vshufpd_avx(auVar64,auVar64,5);
                  auVar64 = vminps_avx(auVar64,auVar74);
                  auVar74 = vpermpd_avx2(auVar64,0x4e);
                  auVar64 = vminps_avx(auVar64,auVar74);
                  auVar64 = vcmpps_avx(auVar63,auVar64,0);
                  auVar74 = local_1360 & auVar64;
                  auVar63 = local_1360;
                  if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar74 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar74 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar74 >> 0x7f,0) != '\0') ||
                        (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar74 >> 0xbf,0) != '\0') ||
                      (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar74[0x1f] < '\0') {
                    auVar63 = vandps_avx(auVar64,local_1360);
                  }
                  auVar64 = vpcmpeqd_avx2(auVar123,auVar123);
                  auVar130 = ZEXT3264(auVar64);
                  uVar40 = vmovmskps_avx(auVar63);
                  uVar43 = 0;
                  for (; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x80000000) {
                    uVar43 = uVar43 + 1;
                  }
                  uVar50 = (ulong)uVar43;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar46 = *(undefined4 *)(local_1340 + uVar50 * 4);
                    uVar2 = *(undefined4 *)(local_1320 + uVar50 * 4);
                    fVar98 = local_12e0[uVar50];
                    fVar70 = local_12c0[uVar50];
                    fVar82 = local_12a0[uVar50];
                    *(float *)(local_1608 + local_1610 * 4 + 0x100) = local_12e0[uVar50 - 8];
                    *(float *)(local_1608 + local_1610 * 4 + 0x180) = fVar98;
                    *(float *)(local_1608 + local_1610 * 4 + 0x1a0) = fVar70;
                    *(float *)(local_1608 + local_1610 * 4 + 0x1c0) = fVar82;
                    *(undefined4 *)(local_1608 + local_1610 * 4 + 0x1e0) = uVar46;
                    *(undefined4 *)(local_1608 + local_1610 * 4 + 0x200) = uVar2;
                    *(uint *)(local_1608 + local_1610 * 4 + 0x220) = local_1660._4_4_;
                    *(uint *)(local_1608 + local_1610 * 4 + 0x240) = uStack_1458;
                    *(uint *)(local_1608 + local_1610 * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(local_1608 + local_1610 * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    local_1460 = CONCAT44(uStack_1458,uStack_1458);
                    local_1660._0_4_ = local_1660._4_4_;
                    uStack_1658._0_4_ = local_1660._4_4_;
                    uStack_1658._4_4_ = local_1660._4_4_;
                    uStack_1650._0_4_ = local_1660._4_4_;
                    uStack_1650._4_4_ = local_1660._4_4_;
                    uStack_1648._0_4_ = local_1660._4_4_;
                    uStack_1648._4_4_ = local_1660._4_4_;
                    auVar137 = ZEXT464(*(uint *)(local_1608 + local_1610 * 4 + 0x100));
                    uStack_1454 = uStack_1458;
                    uStack_1450 = uStack_1458;
                    uStack_144c = uStack_1458;
                    uStack_1448 = uStack_1458;
                    uStack_1444 = uStack_1458;
                    local_1440 = local_1360;
                    while( true ) {
                      local_1060 = *(undefined4 *)(local_1340 + uVar50 * 4);
                      local_1040 = *(undefined4 *)(local_1320 + uVar50 * 4);
                      *(float *)(pRVar38 + sVar37 * 4 + 0x100) = local_12e0[uVar50 - 8];
                      local_10c0 = local_12e0[uVar50];
                      fVar98 = local_12c0[uVar50];
                      local_10a0._4_4_ = fVar98;
                      local_10a0._0_4_ = fVar98;
                      local_10a0._8_4_ = fVar98;
                      local_10a0._12_4_ = fVar98;
                      local_10a0._16_4_ = fVar98;
                      local_10a0._20_4_ = fVar98;
                      local_10a0._24_4_ = fVar98;
                      local_10a0._28_4_ = fVar98;
                      fVar98 = local_12a0[uVar50];
                      local_1080._4_4_ = fVar98;
                      local_1080._0_4_ = fVar98;
                      local_1080._8_4_ = fVar98;
                      local_1080._12_4_ = fVar98;
                      local_1080._16_4_ = fVar98;
                      local_1080._20_4_ = fVar98;
                      local_1080._24_4_ = fVar98;
                      local_1080._28_4_ = fVar98;
                      local_1590.context = context->user;
                      fStack_10bc = local_10c0;
                      fStack_10b8 = local_10c0;
                      fStack_10b4 = local_10c0;
                      fStack_10b0 = local_10c0;
                      fStack_10ac = local_10c0;
                      fStack_10a8 = local_10c0;
                      fStack_10a4 = local_10c0;
                      uStack_105c = local_1060;
                      uStack_1058 = local_1060;
                      uStack_1054 = local_1060;
                      uStack_1050 = local_1060;
                      uStack_104c = local_1060;
                      uStack_1048 = local_1060;
                      uStack_1044 = local_1060;
                      uStack_103c = local_1040;
                      uStack_1038 = local_1040;
                      uStack_1034 = local_1040;
                      uStack_1030 = local_1040;
                      uStack_102c = local_1040;
                      uStack_1028 = local_1040;
                      uStack_1024 = local_1040;
                      local_1020 = local_1660;
                      uStack_1018 = uStack_1658;
                      uStack_1010 = uStack_1650;
                      uStack_1008 = uStack_1648;
                      local_1000 = local_1460;
                      uStack_ff8 = CONCAT44(uStack_1454,uStack_1458);
                      uStack_ff0 = CONCAT44(uStack_144c,uStack_1450);
                      uStack_fe8 = CONCAT44(uStack_1444,uStack_1448);
                      uStack_fdc = (local_1590.context)->instID[0];
                      local_fe0 = uStack_fdc;
                      uStack_fd8 = uStack_fdc;
                      uStack_fd4 = uStack_fdc;
                      uStack_fd0 = uStack_fdc;
                      uStack_fcc = uStack_fdc;
                      uStack_fc8 = uStack_fdc;
                      uStack_fc4 = uStack_fdc;
                      uStack_fbc = (local_1590.context)->instPrimID[0];
                      local_fc0 = uStack_fbc;
                      uStack_fb8 = uStack_fbc;
                      uStack_fb4 = uStack_fbc;
                      uStack_fb0 = uStack_fbc;
                      uStack_fac = uStack_fbc;
                      uStack_fa8 = uStack_fbc;
                      uStack_fa4 = uStack_fbc;
                      local_1420 = local_1240;
                      local_1590.valid = (int *)local_1420;
                      local_1590.geometryUserPtr = pGVar7->userPtr;
                      local_1590.ray = (RTCRayN *)pRVar38;
                      local_1590.hit = (RTCHitN *)&local_10c0;
                      local_1590.N = 8;
                      if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        local_16a0._0_16_ = auVar137._0_16_;
                        auVar63 = ZEXT1632(auVar130._0_16_);
                        (*pGVar7->intersectionFilterN)(&local_1590);
                        auVar137 = ZEXT1664(local_16a0._0_16_);
                        auVar124 = ZEXT3264(local_15c0);
                        auVar63 = vpcmpeqd_avx2(auVar63,auVar63);
                        auVar130 = ZEXT3264(auVar63);
                      }
                      auVar64 = vpcmpeqd_avx2(local_1420,_DAT_01f7b000);
                      auVar63 = auVar130._0_32_ & ~auVar64;
                      if ((((((((auVar63 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar63 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar63 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar63 >> 0x7f,0) == '\0') &&
                            (auVar63 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar63 >> 0xbf,0) == '\0') &&
                          (auVar63 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar63[0x1f]) {
                        auVar64 = auVar64 ^ auVar130._0_32_;
                      }
                      else {
                        p_Var12 = context->args->filter;
                        if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                          local_16a0._0_16_ = auVar137._0_16_;
                          auVar63 = ZEXT1632(auVar130._0_16_);
                          (*p_Var12)(&local_1590);
                          auVar137 = ZEXT1664(local_16a0._0_16_);
                          auVar124 = ZEXT3264(local_15c0);
                          auVar63 = vpcmpeqd_avx2(auVar63,auVar63);
                          auVar130 = ZEXT3264(auVar63);
                        }
                        auVar74 = vpcmpeqd_avx2(local_1420,_DAT_01f7b000);
                        auVar64 = auVar74 ^ auVar130._0_32_;
                        auVar63 = auVar130._0_32_ & ~auVar74;
                        if ((((((((auVar63 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar63 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar63 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar63 >> 0x7f,0) != '\0') ||
                              (auVar63 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar63 >> 0xbf,0) != '\0') ||
                            (auVar63 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar63[0x1f] < '\0') {
                          auVar80._0_4_ = auVar74._0_4_ ^ auVar130._0_4_;
                          auVar80._4_4_ = auVar74._4_4_ ^ auVar130._4_4_;
                          auVar80._8_4_ = auVar74._8_4_ ^ auVar130._8_4_;
                          auVar80._12_4_ = auVar74._12_4_ ^ auVar130._12_4_;
                          auVar80._16_4_ = auVar74._16_4_ ^ auVar130._16_4_;
                          auVar80._20_4_ = auVar74._20_4_ ^ auVar130._20_4_;
                          auVar80._24_4_ = auVar74._24_4_ ^ auVar130._24_4_;
                          auVar80._28_4_ = auVar74._28_4_ ^ auVar130._28_4_;
                          auVar63 = vmaskmovps_avx(auVar80,*(undefined1 (*) [32])local_1590.hit);
                          *(undefined1 (*) [32])(local_1590.ray + 0x180) = auVar63;
                          auVar63 = vmaskmovps_avx(auVar80,*(undefined1 (*) [32])
                                                            (local_1590.hit + 0x20));
                          *(undefined1 (*) [32])(local_1590.ray + 0x1a0) = auVar63;
                          auVar63 = vmaskmovps_avx(auVar80,*(undefined1 (*) [32])
                                                            (local_1590.hit + 0x40));
                          *(undefined1 (*) [32])(local_1590.ray + 0x1c0) = auVar63;
                          auVar63 = vmaskmovps_avx(auVar80,*(undefined1 (*) [32])
                                                            (local_1590.hit + 0x60));
                          *(undefined1 (*) [32])(local_1590.ray + 0x1e0) = auVar63;
                          auVar63 = vmaskmovps_avx(auVar80,*(undefined1 (*) [32])
                                                            (local_1590.hit + 0x80));
                          *(undefined1 (*) [32])(local_1590.ray + 0x200) = auVar63;
                          auVar63 = vpmaskmovd_avx2(auVar80,*(undefined1 (*) [32])
                                                             (local_1590.hit + 0xa0));
                          *(undefined1 (*) [32])(local_1590.ray + 0x220) = auVar63;
                          auVar63 = vpmaskmovd_avx2(auVar80,*(undefined1 (*) [32])
                                                             (local_1590.hit + 0xc0));
                          *(undefined1 (*) [32])(local_1590.ray + 0x240) = auVar63;
                          auVar63 = vpmaskmovd_avx2(auVar80,*(undefined1 (*) [32])
                                                             (local_1590.hit + 0xe0));
                          *(undefined1 (*) [32])(local_1590.ray + 0x260) = auVar63;
                          auVar63 = vpmaskmovd_avx2(auVar80,*(undefined1 (*) [32])
                                                             (local_1590.hit + 0x100));
                          *(undefined1 (*) [32])(local_1590.ray + 0x280) = auVar63;
                        }
                      }
                      if ((((((((auVar64 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar64 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar64 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar64 >> 0x7f,0) == '\0') &&
                            (auVar64 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar64 >> 0xbf,0) == '\0') &&
                          (auVar64 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar64[0x1f]) {
                        *(int *)(pRVar38 + sVar37 * 4 + 0x100) = auVar137._0_4_;
                      }
                      else {
                        auVar137 = ZEXT464(*(uint *)(pRVar38 + sVar37 * 4 + 0x100));
                      }
                      *(undefined4 *)(local_1440 + uVar50 * 4) = 0;
                      uVar46 = auVar137._0_4_;
                      auVar69._4_4_ = uVar46;
                      auVar69._0_4_ = uVar46;
                      auVar69._8_4_ = uVar46;
                      auVar69._12_4_ = uVar46;
                      auVar69._16_4_ = uVar46;
                      auVar69._20_4_ = uVar46;
                      auVar69._24_4_ = uVar46;
                      auVar69._28_4_ = uVar46;
                      auVar64 = vcmpps_avx(auVar124._0_32_,auVar69,2);
                      auVar63 = vandps_avx(auVar64,local_1440);
                      local_1440 = local_1440 & auVar64;
                      if ((((((((local_1440 >> 0x1f & (undefined1  [32])0x1) ==
                                (undefined1  [32])0x0 &&
                               (local_1440 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (local_1440 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(local_1440 >> 0x7f,0) == '\0')
                            && (local_1440 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                            ) && SUB321(local_1440 >> 0xbf,0) == '\0') &&
                          (local_1440 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < local_1440[0x1f]) break;
                      auVar81._8_4_ = 0x7f800000;
                      auVar81._0_8_ = 0x7f8000007f800000;
                      auVar81._12_4_ = 0x7f800000;
                      auVar81._16_4_ = 0x7f800000;
                      auVar81._20_4_ = 0x7f800000;
                      auVar81._24_4_ = 0x7f800000;
                      auVar81._28_4_ = 0x7f800000;
                      auVar64 = vblendvps_avx(auVar81,auVar124._0_32_,auVar63);
                      auVar74 = vshufps_avx(auVar64,auVar64,0xb1);
                      auVar74 = vminps_avx(auVar64,auVar74);
                      auVar15 = vshufpd_avx(auVar74,auVar74,5);
                      auVar74 = vminps_avx(auVar74,auVar15);
                      auVar15 = vpermpd_avx2(auVar74,0x4e);
                      auVar74 = vminps_avx(auVar74,auVar15);
                      auVar74 = vcmpps_avx(auVar64,auVar74,0);
                      auVar15 = auVar63 & auVar74;
                      auVar64 = auVar63;
                      if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar15 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar15 >> 0x7f,0) != '\0') ||
                            (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar15 >> 0xbf,0) != '\0') ||
                          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar15[0x1f] < '\0') {
                        auVar64 = vandps_avx(auVar74,auVar63);
                      }
                      uVar40 = vmovmskps_avx(auVar64);
                      uVar43 = 0;
                      for (; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x80000000) {
                        uVar43 = uVar43 + 1;
                      }
                      uVar50 = (ulong)uVar43;
                      local_1440 = auVar63;
                    }
                  }
                }
              }
            }
          }
          auVar191 = ZEXT1664(local_14f0);
          ray = pRVar38;
          uVar50 = local_16b0;
          uVar51 = local_1600;
          pauVar52 = local_15f8;
          uVar49 = local_1618;
          uVar53 = local_1620;
          uVar54 = local_1630;
          k = sVar37;
          uVar56 = local_1628;
          fVar98 = local_1490;
          fVar70 = fStack_148c;
          fVar82 = fStack_1488;
          fVar85 = fStack_1484;
          fVar93 = local_14a0;
          fVar94 = fStack_149c;
          fVar95 = fStack_1498;
          fVar96 = fStack_1494;
          fVar97 = local_14b0;
          fVar99 = fStack_14ac;
          fVar160 = fStack_14a8;
          fVar161 = fStack_14a4;
          fVar162 = local_14c0;
          fVar169 = fStack_14bc;
          fVar172 = fStack_14b8;
          fVar175 = fStack_14b4;
          fVar184 = local_14d0;
          fVar83 = fStack_14cc;
          fVar84 = fStack_14c8;
          fVar147 = fStack_14c4;
          fVar152 = local_14e0;
          fVar153 = fStack_14dc;
          fVar154 = fStack_14d8;
          fVar155 = fStack_14d4;
        }
      }
      auVar130 = ZEXT1664(local_1500);
      auVar137 = ZEXT1664(local_1510);
      auVar124 = ZEXT1664(local_1520);
      root.ptr = 0;
    }
    uVar46 = *(undefined4 *)(ray + k * 4 + 0x100);
    local_1530._4_4_ = uVar46;
    local_1530._0_4_ = uVar46;
    local_1530._8_4_ = uVar46;
    local_1530._12_4_ = uVar46;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }